

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O2

void __thiscall Array2dTest_Access_Test::Array2dTest_Access_Test(Array2dTest_Access_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001fa3e0;
  return;
}

Assistant:

TEST(Array2dTest, Access)
{
    Array2d<int> a(3, 5, -1);
    for (int i = 0; i < 3; i++)
    for (int j = 0; j < 5; j++)
        a(i, j) = i + j;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 5; j++)
        ASSERT_EQ(i + j, a(i, j));
}